

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall testing::Matcher<char_*>::Matcher(Matcher<char_*> *this,char *value)

{
  MatcherBase<char_*> local_30;
  char *local_18;
  
  (this->super_MatcherBase<char_*>).impl_.value_ = (MatcherInterface<char_*> *)0x0;
  (this->super_MatcherBase<char_*>).impl_.link_.next_ =
       &(this->super_MatcherBase<char_*>).impl_.link_;
  (this->super_MatcherBase<char_*>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00264988;
  local_18 = value;
  internal::EqMatcher::operator_cast_to_Matcher((Matcher<char_*> *)&local_30,(EqMatcher *)&local_18)
  ;
  internal::linked_ptr<const_testing::MatcherInterface<char_*>_>::operator=
            (&(this->super_MatcherBase<char_*>).impl_,&local_30.impl_);
  internal::MatcherBase<char_*>::~MatcherBase(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }